

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigproc.cc
# Opt level: O2

void sptk::snack::crossf(float *data,int size,int start,int nlags,float *engref,int *maxloc,
                        float *maxval,float *correl,int *dbsizep,float **dbdatap)

{
  float *pfVar1;
  int iVar2;
  float *__ptr;
  long lVar3;
  ulong uVar4;
  int iVar5;
  float *pfVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  double dVar10;
  float fVar11;
  double dVar12;
  
  __ptr = *dbdatap;
  iVar5 = start + size + nlags;
  if (*dbsizep < iVar5) {
    free(__ptr);
    __ptr = (float *)malloc((long)iVar5 << 2);
    if (__ptr == (float *)0x0) {
      fwrite("Allocation failure in crossf()\n",0x1f,1,_stderr);
      return;
    }
    *dbdatap = __ptr;
    *dbsizep = iVar5;
  }
  fVar8 = 0.0;
  for (lVar3 = 0; size != (int)lVar3; lVar3 = lVar3 + 1) {
    fVar8 = fVar8 + data[lVar3];
  }
  for (lVar3 = 0; (int)lVar3 != size + nlags + start; lVar3 = lVar3 + 1) {
    __ptr[lVar3] = data[lVar3] - fVar8 / (float)size;
  }
  fVar8 = 0.0;
  for (lVar3 = 0; size != (int)lVar3; lVar3 = lVar3 + 1) {
    fVar8 = fVar8 + __ptr[lVar3] * __ptr[lVar3];
  }
  *engref = fVar8;
  fVar9 = 0.0;
  if (fVar8 <= 0.0) {
    *maxloc = 0;
    for (; *maxval = 0.0, 0 < nlags; nlags = nlags + -1) {
      maxval = correl;
      correl = correl + 1;
    }
  }
  else {
    pfVar1 = __ptr + start;
    for (lVar3 = 0; size != (int)lVar3; lVar3 = lVar3 + 1) {
      fVar9 = fVar9 + pfVar1[lVar3] * pfVar1[lVar3];
    }
    dVar12 = (double)fVar9;
    uVar7 = 0;
    uVar4 = (ulong)(uint)nlags;
    if (nlags < 1) {
      uVar4 = uVar7;
    }
    iVar5 = -1;
    fVar9 = 0.0;
    pfVar6 = pfVar1;
    for (; uVar7 != uVar4; uVar7 = uVar7 + 1) {
      fVar11 = 0.0;
      for (lVar3 = 0; size != (int)lVar3; lVar3 = lVar3 + 1) {
        fVar11 = fVar11 + __ptr[lVar3] * pfVar6[lVar3];
      }
      dVar10 = dVar12 * (double)fVar8;
      if (dVar10 < 0.0) {
        dVar10 = sqrt(dVar10);
      }
      else {
        dVar10 = SQRT(dVar10);
      }
      fVar11 = (float)((double)fVar11 / dVar10);
      *correl = fVar11;
      correl = correl + 1;
      dVar10 = (double)(pfVar6[lVar3] * pfVar6[lVar3]) +
               (dVar12 - (double)(pfVar1[uVar7] * pfVar1[uVar7]));
      dVar12 = 1.0;
      if (1.0 <= dVar10) {
        dVar12 = dVar10;
      }
      iVar2 = (int)uVar7 + start;
      if (fVar11 <= fVar9) {
        fVar11 = fVar9;
        iVar2 = iVar5;
      }
      iVar5 = iVar2;
      fVar9 = fVar11;
      pfVar6 = pfVar6 + 1;
    }
    *maxloc = iVar5;
    *maxval = fVar9;
  }
  return;
}

Assistant:

void crossf(float *data, int size, int start, int nlags, float *engref,
            int *maxloc, float *maxval, float *correl, int *dbsizep,
            float **dbdatap)
#endif
{
#if 0
  static float *dbdata=NULL;
  static int dbsize = 0;
#else
  float *dbdata=*dbdatap;
  int dbsize = *dbsizep;
#endif
  register float *dp, *ds, sum, st;
  register int j;
  register  float *dq, t, *p, engr, *dds, amax;
  register  double engc;
  int i, iloc, total;
#if 0
  int sizei, sizeo, maxsize;
#endif

  /* Compute mean in reference window and subtract this from the
     entire sequence.  This doesn't do too much damage to the data
     sequenced for the purposes of F0 estimation and removes the need for
     more principled (and costly) low-cut filtering. */
  if((total = size+start+nlags) > dbsize) {
    if(dbdata)
      ckfree((void *)dbdata);
    dbdata = NULL;
    dbsize = 0;
    if(!(dbdata = (float*)ckalloc(sizeof(float)*total))) {
      Fprintf(stderr,"Allocation failure in crossf()\n");
      return;/*exit(-1);*/
    }
    dbsize = total;
#if 1
    *dbdatap = dbdata;
    *dbsizep = dbsize;
#endif
  }
  for(engr=0.0, j=size, p=data; j--; ) engr += *p++;
  engr /= size;
  for(j=size+nlags+start, dq = dbdata, p=data; j--; )  *dq++ = *p++ - engr;

#if 0
  maxsize = start + nlags;
  sizei = size + start + nlags + 1;
  sizeo = nlags + 1;
#endif
 
  /* Compute energy in reference window. */
  for(j=size, dp=dbdata, sum=0.0; j--; ) {
    st = *dp++;
    sum += st * st;
  }

  *engref = engr = sum;
  if(engr > 0.0) {    /* If there is any signal energy to work with... */
    /* Compute energy at the first requested lag. */  
    for(j=size, dp=dbdata+start, sum=0.0; j--; ) {
      st = *dp++;
      sum += st * st;
    }
    engc = sum;

    /* COMPUTE CORRELATIONS AT ALL OTHER REQUESTED LAGS. */
    for(i=0, dq=correl, amax=0.0, iloc = -1; i < nlags; i++) {
      for(j=size, sum=0.0, dp=dbdata, dds = ds = dbdata+i+start; j--; )
	sum += *dp++ * *ds++;
      *dq++ = t = (float) (sum/sqrt((double)(engc*engr))); /* output norm. CC */
      engc -= (double)(*dds * *dds); /* adjust norm. energy for next lag */
      if((engc += (double)(*ds * *ds)) < 1.0)
	engc = 1.0;		/* (hack: in case of roundoff error) */
      if(t > amax) {		/* Find abs. max. as we go. */
	amax = t;
	iloc = i+start;
      }
    }
    *maxloc = iloc;
    *maxval = amax;
  } else {	/* No energy in signal; fake reasonable return vals. */
    *maxloc = 0;
    *maxval = 0.0;
    for(p=correl,i=nlags; i-- > 0; )
      *p++ = 0.0;
  }
}